

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_io.c
# Opt level: O2

void csp_send(csp_conn_t *conn,csp_packet_t *packet)

{
  int iVar1;
  
  if (packet == (csp_packet_t *)0x0) {
    return;
  }
  if ((conn != (csp_conn_t *)0x0) && (conn->state == 1)) {
    if (((conn->idout).flags & 2) != 0) {
      iVar1 = csp_rdp_send(conn,packet);
      if (iVar1 != 0) goto LAB_00108319;
    }
    csp_send_direct(&conn->idout,packet,(csp_iface_t *)0x0);
    return;
  }
LAB_00108319:
  csp_buffer_free(packet);
  return;
}

Assistant:

void csp_send(csp_conn_t * conn, csp_packet_t * packet) {

	if (packet == NULL) {
		return;
	}

	if ((conn == NULL) || (conn->state != CONN_OPEN)) {
		csp_buffer_free(packet);
		return;
	}

#if (CSP_USE_RDP)
	if (conn->idout.flags & CSP_FRDP) {
		if (csp_rdp_send(conn, packet) != CSP_ERR_NONE) {
			csp_buffer_free(packet);
			return;
		}
	}
#endif

	csp_send_direct(&conn->idout, packet, NULL);

}